

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
VulkanHppGenerator::generateRAIIHandleConstructor1Return2Vector
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,VulkanHppGenerator *this,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>
          *handle,const_iterator constructorIt,string *enter,string *leave,size_t returnParam,
          map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          *vectorParams)

{
  size_t sVar1;
  bool bVar2;
  pointer ppVar3;
  pointer ppVar4;
  const_reference pvVar5;
  byte local_151;
  string local_118;
  VulkanHppGenerator *local_f8;
  string local_f0;
  ParamData *local_c0;
  VulkanHppGenerator *local_b8;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
  local_b0;
  __normal_iterator<const_VulkanHppGenerator::ParamData_*,_std::vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>_>
  local_a8;
  ParamData *local_a0;
  __normal_iterator<const_VulkanHppGenerator::ParamData_*,_std::vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>_>
  lenParamIt;
  string singularConstructor;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
  local_70;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
  local_68;
  _Base_ptr local_60;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
  local_58;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
  local_50;
  _Base_ptr local_48;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
  local_40;
  string *local_38;
  string *leave_local;
  string *enter_local;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>
  *handle_local;
  VulkanHppGenerator *this_local;
  const_iterator constructorIt_local;
  
  local_38 = leave;
  leave_local = enter;
  enter_local = &handle->first;
  handle_local = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>
                  *)this;
  this_local = (VulkanHppGenerator *)constructorIt._M_node;
  constructorIt_local._M_node = (_Base_ptr)__return_storage_ptr__;
  local_48 = (_Base_ptr)
             std::
             map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
             ::begin(vectorParams);
  local_40 = std::
             next<std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,VulkanHppGenerator::VectorParamData>>>
                       ((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                         )local_48,1);
  ppVar3 = std::
           _Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
           ::operator->(&local_40);
  if (returnParam == ppVar3->first) {
    local_50._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
         ::begin(vectorParams);
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
             ::operator->(&local_50);
    sVar1 = (ppVar3->second).lenParam;
    local_60 = (_Base_ptr)
               std::
               map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
               ::begin(vectorParams);
    local_58 = std::
               next<std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,VulkanHppGenerator::VectorParamData>>>
                         ((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                           )local_60,1);
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
             ::operator->(&local_58);
    if (sVar1 == (ppVar3->second).lenParam) {
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>
                             *)&this_local);
      local_68._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
           ::begin(vectorParams);
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
               ::operator->(&local_68);
      pvVar5 = std::
               vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
               ::operator[](&(ppVar4->second).params,(ppVar3->second).lenParam);
      bVar2 = std::operator==(&(pvVar5->type).type,"uint32_t");
      if (bVar2) {
        ppVar4 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>
                 ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>
                               *)&this_local);
        local_70._M_node =
             (_Base_ptr)
             std::
             map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
             ::begin(vectorParams);
        ppVar3 = std::
                 _Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                 ::operator->(&local_70);
        pvVar5 = std::
                 vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                 ::operator[](&(ppVar4->second).params,ppVar3->first);
        bVar2 = std::operator==(&(pvVar5->type).type,"void");
        local_151 = 0;
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          ppVar4 = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>
                   ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>
                                 *)&this_local);
          singularConstructor.field_2._8_8_ =
               std::
               map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
               ::begin(vectorParams);
          ppVar3 = std::
                   _Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                   ::operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                                 *)((long)&singularConstructor.field_2 + 8));
          pvVar5 = std::
                   vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                   ::operator[](&(ppVar4->second).params,ppVar3->first);
          bVar2 = isHandleType(this,&(pvVar5->type).type);
          local_151 = bVar2 ^ 0xff;
        }
        if ((local_151 & 1) != 0) {
          std::__cxx11::string::string((string *)&lenParamIt);
          ppVar4 = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>
                   ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>
                                 *)&this_local);
          local_a8._M_current =
               (ParamData *)
               std::
               vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
               ::begin(&(ppVar4->second).params);
          local_b0._M_node =
               (_Base_ptr)
               std::
               map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
               ::begin(vectorParams);
          ppVar3 = std::
                   _Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                   ::operator->(&local_b0);
          local_c0 = (ParamData *)
                     __gnu_cxx::
                     __normal_iterator<const_VulkanHppGenerator::ParamData_*,_std::vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>_>
                     ::operator+(&local_a8,(ppVar3->second).lenParam);
          local_b8 = this_local;
          local_a0 = local_c0;
          bVar2 = checkEquivalentSingularConstructor
                            (this,(vector<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>_>_>
                                   *)&enter_local[0xc].field_2,(const_iterator)this_local,
                             (const_iterator)local_c0);
          if (!bVar2) {
            local_f8 = this_local;
            generateRAIIHandleConstructorByCall
                      (&local_f0,this,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>
                        *)enter_local,(const_iterator)this_local,leave_local,local_38,true,true);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &lenParamIt,&local_f0);
            std::__cxx11::string::~string((string *)&local_f0);
          }
          generateRAIIHandleConstructorByCall
                    (&local_118,this,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>
                      *)enter_local,(const_iterator)this_local,leave_local,local_38,true,false);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    (__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &lenParamIt,&local_118);
          std::__cxx11::string::~string((string *)&local_118);
          std::__cxx11::string::~string((string *)&lenParamIt);
          return __return_storage_ptr__;
        }
      }
    }
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, std::string>
  VulkanHppGenerator::generateRAIIHandleConstructor1Return2Vector( std::pair<std::string, HandleData> const &         handle,
                                                                   std::map<std::string, CommandData>::const_iterator constructorIt,
                                                                   std::string const &                                enter,
                                                                   std::string const &                                leave,
                                                                   size_t                                             returnParam,
                                                                   std::map<size_t, VectorParamData> const &          vectorParams ) const
{
  if ( returnParam == std::next( vectorParams.begin() )->first )
  {
    if ( vectorParams.begin()->second.lenParam == std::next( vectorParams.begin() )->second.lenParam )
    {
      if ( constructorIt->second.params[vectorParams.begin()->second.lenParam].type.type == "uint32_t" )
      {
        if ( ( constructorIt->second.params[vectorParams.begin()->first].type.type != "void" ) &&
             !isHandleType( constructorIt->second.params[vectorParams.begin()->first].type.type ) )
        {
          std::string singularConstructor;
          auto        lenParamIt = constructorIt->second.params.begin() + vectorParams.begin()->second.lenParam;
          if ( !checkEquivalentSingularConstructor( handle.second.constructorIts, constructorIt, lenParamIt ) )
          {
            singularConstructor = generateRAIIHandleConstructorByCall( handle, constructorIt, enter, leave, true, true );
          }
          return { singularConstructor, generateRAIIHandleConstructorByCall( handle, constructorIt, enter, leave, true, false ) };
        }
      }
    }
  }
  return {};
}